

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

int Vec_WecSizeUsed(Vec_Wec_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_20;
  undefined4 local_1c;
  int Counter;
  int i;
  Vec_Int_t *vVec;
  Vec_Wec_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_WecSize(p), local_1c < iVar1; local_1c = local_1c + 1) {
    p_00 = Vec_WecEntry(p,local_1c);
    iVar1 = Vec_IntSize(p_00);
    local_20 = (uint)(0 < iVar1) + local_20;
  }
  return local_20;
}

Assistant:

static inline int Vec_WecSizeUsed( Vec_Wec_t * p )
{
    Vec_Int_t * vVec;
    int i, Counter = 0;
    Vec_WecForEachLevel( p, vVec, i )
        Counter += (int)(Vec_IntSize(vVec) > 0);
    return Counter;
}